

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O2

int ggml::cpu::aarch64::repack<block_q4_K,8l,8l>(ggml_tensor *t,void *data,size_t data_size)

{
  uint8_t *puVar1;
  byte bVar2;
  ggml_half gVar3;
  anon_union_4_2_e7985d80_for_data *paVar4;
  int i_1;
  int iVar5;
  int iVar6;
  int iVar7;
  block_q4_K *pbVar8;
  ggml_half *pgVar9;
  int i;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  uint8_t *puVar13;
  int64_t x;
  undefined8 uVar14;
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  byte local_968 [4];
  uint uStack_964;
  uint8_t s [8];
  block_q4_K dst_tmp [8];
  block_q4_Kx8 out;
  
  if (t->type == GGML_TYPE_Q4_K) {
    iVar5 = ggml_nrows();
    iVar6 = (int)(t->ne[0] / 0x100);
    if ((long)(iVar5 * iVar6) * 0x90 - data_size == 0) {
      if ((((uint)t->ne[0] | (uint)t->ne[1]) & 7) == 0) {
        uVar10 = (ulong)iVar6;
        for (iVar7 = 0; iVar7 < iVar5; iVar7 = iVar7 + 8) {
          if ((~((long)uVar10 >> 0x3f) & uVar10) != 0) {
            for (lVar11 = 0; lVar11 != 0x480; lVar11 = lVar11 + 0x90) {
              auVar15 = vmovdqu64_avx512f(*data);
              auVar16 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)data + 0x40));
              auVar17 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                           (*(undefined1 (*) [64])((long)data + 0x40) + 0x10));
              data = (void *)((long)data + uVar10 * 0x90);
              auVar17 = vmovdqu64_avx512f(auVar17);
              *(undefined1 (*) [64])(dst_tmp[0].qs + lVar11 + 0x40) = auVar17;
              auVar17 = vmovdqu64_avx512f(auVar16);
              *(undefined1 (*) [64])(dst_tmp[0].qs + lVar11 + 0x30) = auVar17;
              auVar17 = vmovdqu64_avx512f(auVar15);
              *(undefined1 (*) [64])(dst_tmp[0].scales + lVar11 + -4) = auVar17;
            }
            pbVar8 = dst_tmp;
            for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 1) {
              paVar4 = &pbVar8->data;
              pbVar8 = pbVar8 + 1;
              out.d[lVar11] = (paVar4->data).d;
            }
            pgVar9 = &dst_tmp[0].data.data.dmin;
            for (lVar11 = 0x10; lVar11 != 0x20; lVar11 = lVar11 + 2) {
              gVar3 = *pgVar9;
              pgVar9 = pgVar9 + 0x48;
              *(ggml_half *)((long)out.d + lVar11) = gVar3;
            }
            for (lVar11 = 0; lVar11 != 0x80; lVar11 = lVar11 + 1) {
              *(undefined8 *)(out.qs + lVar11 * 8) =
                   *(undefined8 *)(dst_tmp[(uint)lVar11 & 7].qs + ((uint)lVar11 & 0x78));
            }
            puVar13 = dst_tmp[0].scales + 4;
            for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 1) {
              puVar1 = puVar13 + -4;
              bVar2 = *puVar13;
              puVar13 = puVar13 + 0x90;
              s[lVar11] = *puVar1 & 0x3f;
              local_968[lVar11] = bVar2 & 0x3f;
            }
            vpunpckldq_avx(ZEXT416((uint)s._4_4_),ZEXT416(uStack_964));
            halt_baddata();
          }
          data = (void *)((long)data + (long)(iVar6 * 8) * 0x90);
        }
        iVar5 = 0;
      }
      else {
        iVar5 = -1;
      }
      return iVar5;
    }
    pcVar12 = "data_size == nrow * nblocks * sizeof(block_q4_K)";
    uVar14 = 0x16cc;
  }
  else {
    pcVar12 = "t->type == GGML_TYPE_Q4_K";
    uVar14 = 0x16c2;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
             ,uVar14,"GGML_ASSERT(%s) failed",pcVar12);
}

Assistant:

static int repack_q4_K_to_q4_K_8_bl(struct ggml_tensor * t, int interleave_block, const void * GGML_RESTRICT data, size_t data_size) {
    GGML_ASSERT(t->type == GGML_TYPE_Q4_K);
    GGML_ASSERT(interleave_block == 8);
    constexpr int nrows_interleaved = 8;

    block_q4_Kx8 * dst = (block_q4_Kx8*)t->data;
    const block_q4_K * src = (const block_q4_K*) data;
    block_q4_K dst_tmp[8];
    int nrow = ggml_nrows(t);
    int nblocks = t->ne[0] / QK_K;

    GGML_ASSERT(data_size == nrow * nblocks * sizeof(block_q4_K));

    if (t->ne[1] % nrows_interleaved != 0 || t->ne[0] % 8 != 0) {
        return -1;
    }

    for (int b = 0; b < nrow; b += nrows_interleaved) {
        for (int64_t x = 0; x < nblocks; x++) {
            for (int i  = 0; i < nrows_interleaved; i++ ) {
                dst_tmp[i] = src[x + i * nblocks];
            }
            *dst++ = make_block_q4_Kx8(dst_tmp, interleave_block);
        }
        src += nrows_interleaved * nblocks;
    }
    return 0;

    GGML_UNUSED(data_size);
}